

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

void __thiscall fasttext::QuantMatrix::quantize(QuantMatrix *this,DenseMatrix *mat)

{
  real *x;
  int64_t m;
  Vector norms;
  Vector local_28;
  
  if (this->qnorm_ == true) {
    m = Matrix::size(&mat->super_Matrix,0);
    Vector::Vector(&local_28,m);
    DenseMatrix::l2NormRow(mat,&local_28);
    DenseMatrix::divideRow(mat,&local_28,0,-1);
    quantizeNorm(this,&local_28);
    free(local_28.data_.mem_);
  }
  x = (mat->data_).mem_;
  ProductQuantizer::train
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
             (int32_t)(this->super_Matrix).m_,x);
  ProductQuantizer::compute_codes
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,x,
             (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,(int32_t)(this->super_Matrix).m_);
  return;
}

Assistant:

void QuantMatrix::quantize(DenseMatrix&& mat) {
  if (qnorm_) {
    Vector norms(mat.size(0));
    mat.l2NormRow(norms);
    mat.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = mat.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}